

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# T.c
# Opt level: O2

int envy_bios_parse_bit_T(envy_bios *bios,envy_bios_bit_entry *bit)

{
  uint8_t uVar1;
  byte bVar2;
  ushort uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  envy_bios_T_tmds_info_entry *peVar7;
  ulong uVar8;
  uint idx;
  
  (bios->T).bit = bit;
  idx = 0;
  do {
    iVar4 = parse_at(bios,idx,(char **)0x0);
    idx = idx + 1;
  } while (iVar4 == 0);
  uVar3 = (bios->T).tmds_info.offset;
  if (uVar3 != 0) {
    bios_u8(bios,(uint)uVar3,&(bios->T).tmds_info.version);
    uVar1 = (bios->T).tmds_info.version;
    if ((uVar1 == ' ') || (uVar1 == '\x11')) {
      iVar4 = bios_u8(bios,(bios->T).tmds_info.offset + 1,&(bios->T).tmds_info.hlen);
      iVar5 = bios_u8(bios,(bios->T).tmds_info.offset + 2,&(bios->T).tmds_info.rlen);
      iVar6 = bios_u8(bios,(bios->T).tmds_info.offset + 3,&(bios->T).tmds_info.entriesnum);
      (bios->T).tmds_info.valid = iVar6 == 0 && (iVar5 == 0 && iVar4 == 0);
      bVar2 = (bios->T).tmds_info.entriesnum;
      peVar7 = (envy_bios_T_tmds_info_entry *)malloc((ulong)((uint)bVar2 * 2));
      (bios->T).tmds_info.entries = peVar7;
      for (uVar8 = 0; bVar2 != uVar8; uVar8 = uVar8 + 1) {
        peVar7[uVar8].offset =
             (short)uVar8 * (ushort)(bios->T).tmds_info.rlen +
             (ushort)(bios->T).tmds_info.hlen + (bios->T).tmds_info.offset;
      }
    }
    else {
      fprintf(_stderr,"Unknown TMDS INFO table version 0x%x\n");
    }
  }
  return 0;
}

Assistant:

int
envy_bios_parse_bit_T(struct envy_bios *bios, struct envy_bios_bit_entry *bit)
{
	struct envy_bios_T *t = &bios->T;
	unsigned int idx = 0;

	t->bit = bit;

	while (!parse_at(bios, idx, NULL))
		idx++;

	/* parse tables */
	envy_bios_parse_T_tmds_info(bios);

	return 0;
}